

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_test.c
# Opt level: O1

void test_pair1_recv_no_header(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  nng_msg *local_38;
  nng_msg *m;
  nng_socket c;
  nng_socket s;
  
  nVar1 = nng_pair1_open((nng_socket *)((long)&m + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                         ,0x1ce,"%s: expected success, got %s (%d)","nng_pair1_open(&s)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_pair1_open((nng_socket *)&m);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                           ,0x1cf,"%s: expected success, got %s (%d)","nng_pair1_open(&c)",pcVar3,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_socket_set_bool(m._0_4_,"pair1_test_inject_header",true);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                             ,0x1d0,"%s: expected success, got %s (%d)",
                             "nng_socket_set_bool(c, \"pair1_test_inject_header\", true)",pcVar3,
                             nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_ms(m._4_4_,"recv-timeout",100);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                               ,0x1d1,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(s, NNG_OPT_RECVTIMEO, 100)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_set_ms(m._4_4_,"send-timeout",200);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                                 ,0x1d2,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(s, NNG_OPT_SENDTIMEO, 200)",pcVar3,nVar1);
          if (iVar2 != 0) {
            nVar1 = nuts_marry(m._0_4_,m._4_4_);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                                   ,0x1d4,"%s: expected success, got %s (%d)","nuts_marry(c, s)",
                                   pcVar3,nVar1);
            if (iVar2 != 0) {
              nVar1 = nng_msg_alloc(&local_38,0);
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                                     ,0x1d6,"%s: expected success, got %s (%d)",
                                     "nng_msg_alloc(&m, 0)",pcVar3,nVar1);
              if (iVar2 != 0) {
                nVar1 = nng_sendmsg(m._0_4_,local_38,0);
                pcVar3 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                                       ,0x1d7,"%s: expected success, got %s (%d)",
                                       "nng_sendmsg(c, m, 0)",pcVar3,nVar1);
                if (iVar2 != 0) {
                  num = nng_recvmsg(m._4_4_,&local_38,0);
                  pcVar3 = nng_strerror(NNG_ETIMEDOUT);
                  acutest_check_((uint)(num == NNG_ETIMEDOUT),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                                 ,0x1d8,"%s fails with %s","nng_recvmsg(s, &m, 0)",pcVar3,nVar1);
                  pcVar3 = nng_strerror(NNG_ETIMEDOUT);
                  pcVar4 = nng_strerror(num);
                  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_recvmsg(s, &m, 0)",
                                   pcVar3,5,pcVar4,(ulong)num);
                  nVar1 = nng_socket_close(m._0_4_);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                                         ,0x1da,"%s: expected success, got %s (%d)",
                                         "nng_socket_close(c)",pcVar3,nVar1);
                  if (iVar2 != 0) {
                    nVar1 = nng_socket_close(m._4_4_);
                    pcVar3 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_test.c"
                                           ,0x1db,"%s: expected success, got %s (%d)",
                                           "nng_socket_close(s)",pcVar3,nVar1);
                    if (iVar2 != 0) {
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_pair1_recv_no_header(void)
{
	nng_socket s;
	nng_socket c;
	nng_msg   *m;

	NUTS_PASS(nng_pair1_open(&s));
	NUTS_PASS(nng_pair1_open(&c));
	NUTS_PASS(nng_socket_set_bool(c, "pair1_test_inject_header", true));
	NUTS_PASS(nng_socket_set_ms(s, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s, NNG_OPT_SENDTIMEO, 200));

	NUTS_MARRY(c, s);

	NUTS_PASS(nng_msg_alloc(&m, 0));
	NUTS_PASS(nng_sendmsg(c, m, 0));
	NUTS_FAIL(nng_recvmsg(s, &m, 0), NNG_ETIMEDOUT);

	NUTS_CLOSE(c);
	NUTS_CLOSE(s);
}